

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

QSize __thiscall QColumnView::sizeHint(QColumnView *this)

{
  long lVar1;
  undefined8 uVar2;
  QSize QVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (*(long *)(lVar1 + 0x550) == 0) {
    uVar6 = 0xffffffff;
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = 0xffffffff;
    uVar5 = 0;
    uVar6 = 0xffffffff;
    do {
      uVar2 = (**(code **)(**(long **)(*(long *)(lVar1 + 0x548) + uVar5 * 8) + 0x70))();
      uVar6 = uVar6 + (int)uVar2;
      uVar4 = uVar4 + (int)((ulong)uVar2 >> 0x20);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(ulong *)(lVar1 + 0x550));
  }
  QVar3 = QAbstractScrollArea::sizeHint((QAbstractScrollArea *)this);
  uVar5 = (ulong)QVar3 >> 0x20;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 <= QVar3.wd.m_i.m_i) {
    uVar7 = (ulong)QVar3 & 0xffffffff;
  }
  if (QVar3.ht.m_i.m_i < (int)uVar4) {
    uVar5 = (ulong)uVar4;
  }
  return (QSize)(uVar5 << 0x20 | uVar7);
}

Assistant:

QSize QColumnView::sizeHint() const
{
    Q_D(const QColumnView);
    QSize sizeHint;
    for (int i = 0; i < d->columns.size(); ++i) {
        sizeHint += d->columns.at(i)->sizeHint();
    }
    return sizeHint.expandedTo(QAbstractItemView::sizeHint());
}